

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O0

void __thiscall
CppUnit::TestFactoryRegistry::addTestToSuite(TestFactoryRegistry *this,TestSuite *suite)

{
  iterator this_00;
  bool bVar1;
  int iVar2;
  reference ppTVar3;
  undefined4 extraout_var;
  TestFactory *factory;
  _Self local_20;
  iterator it;
  TestSuite *suite_local;
  TestFactoryRegistry *this_local;
  
  it._M_node = (_Base_ptr)suite;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<CppUnit::TestFactory_*,_std::less<CppUnit::TestFactory_*>,_std::allocator<CppUnit::TestFactory_*>_>
       ::begin(&this->m_factories);
  while( true ) {
    factory = (TestFactory *)
              std::
              set<CppUnit::TestFactory_*,_std::less<CppUnit::TestFactory_*>,_std::allocator<CppUnit::TestFactory_*>_>
              ::end(&this->m_factories);
    bVar1 = std::operator!=(&local_20,(_Self *)&factory);
    if (!bVar1) break;
    ppTVar3 = std::_Rb_tree_const_iterator<CppUnit::TestFactory_*>::operator*(&local_20);
    this_00 = it;
    iVar2 = (*(*ppTVar3)->_vptr_TestFactory[2])();
    TestSuite::addTest((TestSuite *)this_00._M_node,(Test *)CONCAT44(extraout_var,iVar2));
    std::_Rb_tree_const_iterator<CppUnit::TestFactory_*>::operator++(&local_20);
  }
  return;
}

Assistant:

void 
TestFactoryRegistry::addTestToSuite( TestSuite *suite )
{
  for ( Factories::iterator it = m_factories.begin(); 
        it != m_factories.end(); 
        ++it )
  {
    TestFactory *factory = *it;
    suite->addTest( factory->makeTest() );
  }
}